

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O3

uint __thiscall
covenant::DFA_impl::
StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *es,
          bool accept,uint base)

{
  _Rb_tree_header *p_Var1;
  StateCache *this_00;
  pointer *pppSVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  StateEntry *pSVar5;
  _Rb_tree_node_base *p_Var6;
  size_t sVar7;
  node_pointer ppVar8;
  ulong uVar9;
  int iVar10;
  emplace_return eVar11;
  StateEntry *entry;
  StateEntry *local_38;
  
  iVar4 = (int)(es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  iVar3 = this->tempsz;
  if (this->tempsz < iVar4) {
    do {
      iVar10 = iVar3;
      iVar3 = iVar10 * 2;
    } while (iVar3 < iVar4);
    this->tempsz = iVar3;
    pSVar5 = (StateEntry *)realloc(this->temp,(long)(iVar10 << 2) * 4 + 8);
    this->temp = pSVar5;
    iVar4 = (int)(es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    pSVar5 = this->temp;
  }
  pSVar5->sz = iVar4 + 1;
  pSVar5->data[0] = (uint)accept;
  p_Var6 = (es->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(es->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    uVar9 = 1;
    do {
      pSVar5->data[uVar9] = p_Var6[1]._M_color;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      uVar9 = (ulong)((int)uVar9 + 1);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  this_00 = &this->cache;
  sVar7 = boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>,_const_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry>_>
          ::hash(&this_00->table_,&this->temp);
  ppVar8 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
           ::
           find_node_impl<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
                       *)this_00,sVar7,&this->temp,
                      (EqEntry *)
                      ((this->cache).table_.
                       super_functions<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry>
                       .funcs_ +
                      ((this->cache).table_.
                       super_functions<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::EqEntry>
                       .current_ & 1)));
  if (ppVar8 == (node_pointer)0x0) {
    sVar7 = (es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    local_38 = (StateEntry *)malloc(sVar7 * 8 + 8);
    __position._M_current =
         (this->entries).
         super__Vector_base<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->entries).
        super__Vector_base<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry*,std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry*>>
      ::
      _M_realloc_insert<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry*const&>
                ((vector<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry*,std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry*>>
                  *)&this->entries,__position,&local_38);
      sVar7 = (es->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      *__position._M_current = local_38;
      pppSVar2 = &(this->entries).
                  super__Vector_base<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar2 = *pppSVar2 + 1;
    }
    pSVar5 = local_38;
    local_38->sz = (int)sVar7 + 1;
    local_38->data[0] = (uint)accept;
    p_Var6 = (es->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      uVar9 = 1;
      do {
        pSVar5->data[uVar9] = p_Var6[1]._M_color;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        uVar9 = (ulong)((int)uVar9 + 1);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    eVar11 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
             ::
             try_emplace_unique<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>::EqEntry>>
                         *)this_00,&local_38);
    *(uint *)((long)&((eVar11.first.node_.node_)->value_base_).data_.data_ + 8) = base;
  }
  else {
    base = *(uint *)((long)&(ppVar8->value_base_).data_.data_ + 8);
  }
  return base;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }